

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

undefined8 __thiscall
StringInstance::op_first
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  int *piVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [16];
  string *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff37;
  string *in_stack_ffffffffffffff38;
  string local_a8 [36];
  int local_84;
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  iVar1 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bc192);
  local_1c = iVar1;
  if (iVar1 < 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  local_84 = std::__cxx11::string::size();
  piVar4 = std::min<int>(&local_1c,&local_84);
  local_1c = *piVar4;
  __rhs = local_e8;
  std::__cxx11::string::substr((ulong)__rhs,in_RSI + 0x58);
  str_utils::escape(in_stack_ffffffffffffff38,in_stack_ffffffffffffff37);
  std::operator+((char *)CONCAT44(iVar1,in_stack_fffffffffffffee8),__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffee8),(char *)__rhs);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::__cxx11::string::~string((string *)local_e8);
  return in_RDI;
}

Assistant:

std::string StringInstance::op_first(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(0, n), '"') + "\"";
}